

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammarResolver.cpp
# Opt level: O3

XSModel * __thiscall xercesc_4_0::GrammarResolver::getXSModel(GrammarResolver *this)

{
  ValueVectorOf<xercesc_4_0::SchemaGrammar_*> *this_00;
  XMLSize_t XVar1;
  int iVar2;
  undefined4 extraout_var;
  SchemaGrammar *pSVar3;
  XSModel *this_01;
  XSModel *pXVar4;
  RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *toEnum;
  XSModel **ppXVar5;
  bool XSModelWasChanged;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> grammarEnum;
  char local_59;
  RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> local_58;
  
  if ((this->fCacheGrammar == false) && (this->fUseCachedGrammar != true)) {
    if (this->fGrammarsToAddToXSModel->fCurCount == 0) {
      if (this->fXSModel != (XSModel *)0x0) {
        return this->fXSModel;
      }
      pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      XSModel::XSModel(pXVar4,(XSModel *)0x0,this,this->fMemoryManager);
    }
    else {
      pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      XSModel::XSModel(pXVar4,this->fXSModel,this,this->fMemoryManager);
      this->fGrammarsToAddToXSModel->fCurCount = 0;
    }
  }
  else {
    iVar2 = (*this->fGrammarPool->_vptr_XMLGrammarPool[0xd])(this->fGrammarPool,&local_59);
    pXVar4 = (XSModel *)CONCAT44(extraout_var,iVar2);
    if (local_59 == '\x01') {
      ppXVar5 = &this->fGrammarPoolXSModel;
      if (((this->fGrammarPoolXSModel == (XSModel *)0x0) &&
          (this->fGrammarsToAddToXSModel->fCurCount == 0)) && (this->fXSModel == (XSModel *)0x0)) {
        *ppXVar5 = pXVar4;
        return pXVar4;
      }
      this->fGrammarPoolXSModel = pXVar4;
      this->fGrammarsToAddToXSModel->fCurCount = 0;
      toEnum = this->fGrammarBucket;
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      RefHashTableOfEnumerator(&local_58,toEnum,false,this->fMemoryManager);
      while ((local_58.fCurElem != (RefHashTableBucketElem<xercesc_4_0::Grammar> *)0x0 ||
             (local_58.fCurHash != (local_58.fToEnum)->fHashModulus))) {
        pSVar3 = (SchemaGrammar *)
                 RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
                 nextElement(&local_58);
        iVar2 = (*(pSVar3->super_Grammar).super_XSerializable._vptr_XSerializable[5])(pSVar3);
        if (iVar2 == 1) {
          this_00 = this->fGrammarsToAddToXSModel;
          toEnum = (RefHashTableOf<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher> *)0x1;
          ValueVectorOf<xercesc_4_0::SchemaGrammar_*>::ensureExtraCapacity(this_00,1);
          XVar1 = this_00->fCurCount;
          this_00->fCurCount = XVar1 + 1;
          this_00->fElemList[XVar1] = pSVar3;
        }
      }
      pXVar4 = this->fXSModel;
      if (pXVar4 != (XSModel *)0x0) {
        XSModel::~XSModel(pXVar4);
      }
      XMemory::operator_delete((XMemory *)pXVar4,toEnum);
      if (this->fGrammarsToAddToXSModel->fCurCount == 0) {
        this->fXSModel = (XSModel *)0x0;
      }
      else {
        pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
        XSModel::XSModel(pXVar4,this->fGrammarPoolXSModel,this,this->fMemoryManager);
        this->fXSModel = pXVar4;
        this->fGrammarsToAddToXSModel->fCurCount = 0;
        ppXVar5 = &this->fXSModel;
      }
      pXVar4 = *ppXVar5;
      RefHashTableOfEnumerator<xercesc_4_0::Grammar,_xercesc_4_0::StringHasher>::
      ~RefHashTableOfEnumerator(&local_58);
      return pXVar4;
    }
    pXVar4 = this->fXSModel;
    if (this->fGrammarsToAddToXSModel->fCurCount != 0) {
      this_01 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
      if (pXVar4 == (XSModel *)0x0) {
        XSModel::XSModel(this_01,this->fGrammarPoolXSModel,this,this->fMemoryManager);
      }
      else {
        XSModel::XSModel(this_01,this->fXSModel,this,this->fMemoryManager);
      }
      this->fXSModel = this_01;
      this->fGrammarsToAddToXSModel->fCurCount = 0;
      return this_01;
    }
    if (pXVar4 != (XSModel *)0x0) {
      return pXVar4;
    }
    if (this->fGrammarPoolXSModel != (XSModel *)0x0) {
      return this->fGrammarPoolXSModel;
    }
    pXVar4 = (XSModel *)XMemory::operator_new(0x130,this->fMemoryManager);
    XSModel::XSModel(pXVar4,(XSModel *)0x0,this,this->fMemoryManager);
  }
  this->fXSModel = pXVar4;
  return pXVar4;
}

Assistant:

XSModel *GrammarResolver::getXSModel()
{
    XSModel* xsModel;
    if (fCacheGrammar || fUseCachedGrammar)
    {
        // We know if the grammarpool changed thru caching, orphaning and erasing
        // but NOT by other mechanisms such as lockPool() or unlockPool() so it
        // is safest to always get it.  The grammarPool XSModel will only be 
        // regenerated if something changed.
        bool XSModelWasChanged;
        // The grammarpool will always return an xsmodel, even if it is just
        // the schema for schema xsmodel...
        xsModel = fGrammarPool->getXSModel(XSModelWasChanged);
        if (XSModelWasChanged)
        {
            // we know the grammarpool XSModel has changed or this is the
            // first call to getXSModel
            if (!fGrammarPoolXSModel && (fGrammarsToAddToXSModel->size() == 0) &&
                !fXSModel)
            { 
                fGrammarPoolXSModel = xsModel;
                return fGrammarPoolXSModel;
            }
            else
            {
                fGrammarPoolXSModel = xsModel;
                // We had previously augmented the grammar pool XSModel
                // with our our grammars or we would like to upate it now
                // so we have to regenerate the XSModel
                fGrammarsToAddToXSModel->removeAllElements();
                RefHashTableOfEnumerator<Grammar> grammarEnum(fGrammarBucket, false, fMemoryManager);
                while (grammarEnum.hasMoreElements()) 
                {
                    Grammar& grammar = (Grammar&) grammarEnum.nextElement();
                    if (grammar.getGrammarType() == Grammar::SchemaGrammarType)
                        fGrammarsToAddToXSModel->addElement((SchemaGrammar*)&grammar);
                }
                delete fXSModel;
                if (fGrammarsToAddToXSModel->size())
                {                    
                    fXSModel = new (fMemoryManager) XSModel(fGrammarPoolXSModel, this, fMemoryManager);
                    fGrammarsToAddToXSModel->removeAllElements();
                    return fXSModel;
                }       
                fXSModel = 0; 
                return fGrammarPoolXSModel;                                                      
            }       
        }
        else {
            // we know that the grammar pool XSModel is the same as before
            if (fGrammarsToAddToXSModel->size())
            {
                // we need to update our fXSModel with the new grammars               
                if (fXSModel)
                {
                    xsModel = new (fMemoryManager) XSModel(fXSModel, this, fMemoryManager);                   
                    fXSModel = xsModel;
                }
                else
                {
                    fXSModel = new (fMemoryManager) XSModel(fGrammarPoolXSModel, this, fMemoryManager);
                }
                fGrammarsToAddToXSModel->removeAllElements();
                return fXSModel;
            }
            // Nothing has changed!
            if (fXSModel)
            {
                return fXSModel;
            }
            else if (fGrammarPoolXSModel)
            {
                return fGrammarPoolXSModel;
            }
            fXSModel = new (fMemoryManager) XSModel(0, this, fMemoryManager);    
            return fXSModel;    
        }
    }
    // Not Caching...
    if (fGrammarsToAddToXSModel->size())
    {      
        xsModel = new (fMemoryManager) XSModel(fXSModel, this, fMemoryManager);
        fGrammarsToAddToXSModel->removeAllElements();
        fXSModel = xsModel;             
    }
    else if (!fXSModel)
    {
        // create a new model only if we didn't have one already
        fXSModel = new (fMemoryManager) XSModel(0, this, fMemoryManager);
    }
    return fXSModel; 
}